

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<unsigned_int>::emplace_back<unsigned_int_const&>
          (SmallVectorBase<unsigned_int> *this,uint *args)

{
  size_type sVar1;
  pointer puVar2;
  
  sVar1 = this->len;
  puVar2 = this->data_ + sVar1;
  if (sVar1 == this->cap) {
    puVar2 = emplaceRealloc<unsigned_int_const&>(this,puVar2,args);
    return puVar2;
  }
  this->data_[sVar1] = *args;
  this->len = sVar1 + 1;
  return puVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }